

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O2

bool Memory::HeapBlockList::Contains<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
               (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *block,
               SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *list,
               SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *tail)

{
  for (; (list != block && (list != tail));
      list = SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(list)) {
  }
  return list != tail;
}

Assistant:

static bool Contains(TBlockType * block, TBlockType * list, TBlockType * tail = nullptr)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            if (heapBlock == block)
            {
                return true;
            }
            heapBlock = heapBlock->GetNextBlock();
        }
        return false;
    }